

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void hexdump(void *buf,int len)

{
  int in_ESI;
  long in_RDI;
  uchar *p;
  int n;
  int local_10;
  
  printf("\nHex dump\n");
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    printf("%02x",(ulong)*(byte *)(in_RDI + local_10));
    if ((local_10 + 1) % 2 == 0) {
      printf(" ");
    }
    if ((local_10 + 1) % 0x20 == 0) {
      printf("\n");
    }
  }
  printf("\n");
  return;
}

Assistant:

void hexdump(void *buf, int len)
{
        int n;
        unsigned char *p = buf;

        printf("\nHex dump\n");

        for (n = 0; n < len; n++) {
                printf("%02x", p[n]);

                if ((n + 1) % 2 == 0)
                        printf(" ");
                if ((n + 1) % 32 == 0)
                        printf("\n");
        }
        printf("\n");
}